

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::gen_getp_case_conv
              (vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc,
              _func_wchar_t_ptr_wchar_t *conv)

{
  size_t sVar1;
  int iVar2;
  vm_obj_id_t obj;
  wchar_t wVar3;
  CVmObject *this;
  char *str_00;
  size_t *rem_00;
  size_t sVar4;
  long in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  code *in_R8;
  wchar_t *u_1;
  wchar_t ch_1;
  vm_obj_id_t result_obj;
  wchar_t *u;
  wchar_t ch;
  size_t rem;
  utf8_ptr dstp;
  utf8_ptr srcp;
  size_t dstlen;
  size_t srclen;
  CVmNativeCodeDesc *in_stack_ffffffffffffff68;
  wchar_t *in_stack_ffffffffffffff70;
  vm_val_t *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  wchar_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  wchar_t in_stack_ffffffffffffff94;
  utf8_ptr local_60;
  utf8_ptr local_58;
  long local_50;
  size_t local_48;
  code *local_30;
  long local_20;
  vm_val_t *local_18;
  vm_val_t *local_10;
  
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((gen_getp_case_conv(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*,wchar_t_const*(*)(wchar_t))
       ::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&gen_getp_case_conv(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*,wchar_t_const*(*)(wchar_t))
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&gen_getp_case_conv::desc,0);
    __cxa_guard_release(&gen_getp_case_conv(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*,wchar_t_const*(*)(wchar_t))
                         ::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff78,(uint *)in_stack_ffffffffffffff70,
                     in_stack_ffffffffffffff68);
  if (iVar2 == 0) {
    local_48 = vmb_get_len((char *)0x33f903);
    CVmStack::push(local_18);
    utf8_ptr::utf8_ptr(&local_58);
    utf8_ptr::utf8_ptr(&local_60);
    local_50 = 0;
    utf8_ptr::set(&local_58,(char *)(local_20 + 2));
    sVar1 = local_48;
    while (sVar1 != 0) {
      in_stack_ffffffffffffff94 = utf8_ptr::getch((utf8_ptr *)0x33f961);
      in_stack_ffffffffffffff88 = (wchar_t *)(*local_30)(in_stack_ffffffffffffff94);
      if (in_stack_ffffffffffffff88 == (wchar_t *)0x0) {
        in_stack_ffffffffffffff70 = (wchar_t *)utf8_ptr::s_wchar_size(in_stack_ffffffffffffff94);
      }
      else {
        in_stack_ffffffffffffff70 = (wchar_t *)utf8_ptr::s_wstr_size(in_stack_ffffffffffffff70);
      }
      local_50 = (long)in_stack_ffffffffffffff70 + local_50;
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    (size_t *)in_stack_ffffffffffffff78);
    }
    obj = create((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(size_t)in_stack_ffffffffffffff68);
    this = vm_objp(0);
    str_00 = cons_get_buf((CVmObjString *)this);
    utf8_ptr::set(&local_60,str_00);
    utf8_ptr::set(&local_58,(char *)(local_20 + 2));
    sVar1 = local_48;
    while (sVar1 != 0) {
      wVar3 = utf8_ptr::getch((utf8_ptr *)0x33fa19);
      rem_00 = (size_t *)(*local_30)(wVar3);
      if (rem_00 == (size_t *)0x0) {
        utf8_ptr::setch((utf8_ptr *)CONCAT44(obj,wVar3),L'\0',(size_t *)in_stack_ffffffffffffff70);
      }
      else {
        sVar4 = utf8_ptr::setwcharsz
                          ((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                           ,in_stack_ffffffffffffff88,CONCAT44(obj,wVar3));
        local_50 = local_50 - sVar4;
      }
      utf8_ptr::inc((utf8_ptr *)CONCAT44(obj,wVar3),rem_00);
    }
    vm_val_t::set_obj(local_10,obj);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjString::gen_getp_case_conv(
    VMG_ vm_val_t *retval, const vm_val_t *self_val,
    const char *str, uint *argc, const wchar_t *(*conv)(wchar_t))
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get my length */
    size_t srclen = vmb_get_len(str);

    /* leave the string on the stack as GC protection */
    G_stk->push(self_val);

    /* 
     *   Scan the string to determine how long the result will be.  The
     *   result won't necessarily be the same length as the original: some
     *   case conversions are 1:N characters, and even when they're 1:1, a
     *   two-byte character in the original could turn into a three-byte
     *   character in the result, and vice versa.
     */
    size_t dstlen;
    utf8_ptr srcp, dstp;
    size_t rem;
    for (dstlen = 0, srcp.set((char *)str + VMB_LEN), rem = srclen ;
         rem != 0 ; srcp.inc(&rem))
    {
        /* get the mapping for this character */
        wchar_t ch = srcp.getch();
        const wchar_t *u = conv(ch);

        /* add up the byte length of the mapping */
        dstlen += (u != 0
                   ? utf8_ptr::s_wstr_size(u)
                   : utf8_ptr::s_wchar_size(ch));
    }

    /* allocate the result string */
    vm_obj_id_t result_obj = CVmObjString::create(vmg_ FALSE, dstlen);

    /* get a pointer to the result buffer */
    dstp.set(((CVmObjString *)vm_objp(vmg_ result_obj))->cons_get_buf());

    /* write the string */
    for (srcp.set((char *)str + VMB_LEN), rem = srclen ;
         rem != 0 ; srcp.inc(&rem))
    {
        /* get the mapping for this character */
        wchar_t ch = srcp.getch();
        const wchar_t *u = conv(ch);

        /* put the character(s) */
        if (u != 0)
            dstlen -= dstp.setwcharsz(u, dstlen);
        else
            dstp.setch(ch, &dstlen);
    }

    /* return the value */
    retval->set_obj(result_obj);

    /* discard GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}